

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkippedTest.cpp
# Opt level: O0

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::SkippedTest::result(SkippedTest *this)

{
  unique_ptr<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_> local_28;
  unique_ptr<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_> local_20 [2];
  SkippedTest *this_local;
  
  this_local = this;
  std::make_unique<oout::SuccessResult>();
  std::
  make_unique<oout::TestResult,std::unique_ptr<oout::SuccessResult,std::default_delete<oout::SuccessResult>>>
            (local_20);
  std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>::
  unique_ptr<oout::TestResult,std::default_delete<oout::TestResult>,void>
            ((unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>> *)this,
             (unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_20);
  std::unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_>::~unique_ptr
            ((unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_20);
  std::unique_ptr<oout::SuccessResult,_std::default_delete<oout::SuccessResult>_>::~unique_ptr
            (&local_28);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> SkippedTest::result() const
{
	return make_unique<TestResult>(make_unique<SuccessResult>());
}